

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

char * __thiscall
duckdb::StrfTimeFormat::WriteDateSpecifier
          (StrfTimeFormat *this,StrTimeSpecifier specifier,date_t date,char *target)

{
  int iVar1;
  uint32_t uVar2;
  int32_t iVar3;
  long lVar4;
  char *pcVar5;
  InternalException *this_00;
  undefined1 *puVar6;
  bool monday_first;
  undefined7 in_register_00000031;
  StrfTimeFormat *pSVar7;
  ulong __n;
  date_t in_stack_ffffffffffffffc4;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,specifier);
  switch(iVar1) {
  case 0x19:
    pSVar7 = (StrfTimeFormat *)(ulong)(uint)date.days;
    uVar2 = Date::ExtractDayOfTheYear(in_stack_ffffffffffffffc4);
    pcVar5 = WritePadded3(pSVar7,target,uVar2);
    return pcVar5;
  case 0x1a:
    uVar2 = Date::ExtractDayOfTheYear(in_stack_ffffffffffffffc4);
    iVar1 = NumericHelper::UnsignedLength<unsigned_int>(uVar2);
    NumericHelper::FormatUnsigned<unsigned_int>(uVar2,target + iVar1);
    return target + iVar1;
  case 0x1b:
    monday_first = false;
    break;
  case 0x1c:
    monday_first = true;
    break;
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
switchD_0187341d_caseD_1d:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented date specifier for strftime",
               (allocator *)&stack0xffffffffffffffc7);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x21:
    pSVar7 = (StrfTimeFormat *)(ulong)(uint)date.days;
    uVar2 = Date::ExtractISOYearNumber(date);
    pcVar5 = WritePadded(pSVar7,target,uVar2,4);
    return pcVar5;
  case 0x22:
    iVar3 = Date::ExtractISODayOfTheWeek(date);
    *target = (char)iVar3 + '0';
    goto LAB_0187352f;
  case 0x23:
    iVar1 = Date::ExtractISOWeekNumber(date);
    goto LAB_018734db;
  default:
    if (iVar1 != 2) {
      if (iVar1 == 1) {
        iVar1 = Date::ExtractISODayOfTheWeek(date);
        puVar6 = Date::DAY_NAMES;
      }
      else {
        if (iVar1 != 0) goto switchD_0187341d_caseD_1d;
        iVar1 = Date::ExtractISODayOfTheWeek(date);
        puVar6 = Date::DAY_NAMES_ABBREVIATED;
      }
      lVar4 = (long)(iVar1 % 7) * 0x10;
      __n = (ulong)*(uint *)(puVar6 + lVar4);
      if (__n < 0xd) {
        puVar6 = puVar6 + lVar4 + 4;
      }
      else {
        puVar6 = *(undefined1 **)(puVar6 + lVar4 + 8);
      }
      switchD_0193dc74::default(target,puVar6,__n);
      return target + __n;
    }
    iVar3 = Date::ExtractISODayOfTheWeek(date);
    *target = (char)(iVar3 % 7) + '0';
LAB_0187352f:
    return target + 1;
  }
  iVar1 = Date::ExtractWeekNumberRegular(date,monday_first);
LAB_018734db:
  *(undefined2 *)target =
       *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + (uint)(iVar1 * 2));
  return target + 2;
}

Assistant:

char *StrfTimeFormat::WriteDateSpecifier(StrTimeSpecifier specifier, date_t date, char *target) const {
	switch (specifier) {
	case StrTimeSpecifier::ABBREVIATED_WEEKDAY_NAME: {
		auto dow = Date::ExtractISODayOfTheWeek(date);
		target = WriteString(target, Date::DAY_NAMES_ABBREVIATED[dow % 7]);
		break;
	}
	case StrTimeSpecifier::FULL_WEEKDAY_NAME: {
		auto dow = Date::ExtractISODayOfTheWeek(date);
		target = WriteString(target, Date::DAY_NAMES[dow % 7]);
		break;
	}
	case StrTimeSpecifier::WEEKDAY_DECIMAL: {
		auto dow = Date::ExtractISODayOfTheWeek(date);
		*target = char('0' + uint8_t(dow % 7));
		target++;
		break;
	}
	case StrTimeSpecifier::DAY_OF_YEAR_PADDED: {
		int32_t doy = Date::ExtractDayOfTheYear(date);
		target = WritePadded3(target, UnsafeNumericCast<uint32_t>(doy));
		break;
	}
	case StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(Date::ExtractWeekNumberRegular(date, true)));
		break;
	case StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(Date::ExtractWeekNumberRegular(date, false)));
		break;
	case StrTimeSpecifier::WEEK_NUMBER_ISO:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(Date::ExtractISOWeekNumber(date)));
		break;
	case StrTimeSpecifier::DAY_OF_YEAR_DECIMAL: {
		auto doy = UnsafeNumericCast<uint32_t>(Date::ExtractDayOfTheYear(date));
		target += NumericHelper::UnsignedLength<uint32_t>(doy);
		NumericHelper::FormatUnsigned(doy, target);
		break;
	}
	case StrTimeSpecifier::YEAR_ISO:
		target = WritePadded(target, UnsafeNumericCast<uint32_t>(Date::ExtractISOYearNumber(date)), 4);
		break;
	case StrTimeSpecifier::WEEKDAY_ISO:
		*target = char('0' + uint8_t(Date::ExtractISODayOfTheWeek(date)));
		target++;
		break;
	default:
		throw InternalException("Unimplemented date specifier for strftime");
	}
	return target;
}